

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * __thiscall
flatbuffers::Namespace::GetFullyQualifiedName
          (string *__return_storage_ptr__,Namespace *this,string *name,size_t max_components)

{
  bool bVar1;
  unsigned_long *puVar2;
  const_reference pvVar3;
  ulong uVar4;
  long lVar5;
  size_type_conflict local_40;
  ulong local_38;
  size_t i;
  size_t local_28;
  size_t max_components_local;
  string *name_local;
  Namespace *this_local;
  string *stream_str;
  
  local_28 = max_components;
  max_components_local = (size_t)name;
  name_local = (string *)this;
  this_local = (Namespace *)__return_storage_ptr__;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->components);
  if ((bVar1) || (local_28 == 0)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)max_components_local);
  }
  else {
    i._7_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_38 = 0;
    while( true ) {
      uVar4 = local_38;
      local_40 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->components);
      puVar2 = std::min<unsigned_long>(&local_40,&local_28);
      if (*puVar2 <= uVar4) break;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->components,local_38);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar3);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
      local_38 = local_38 + 1;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::pop_back();
    }
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)max_components_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Namespace::GetFullyQualifiedName(const std::string &name,
                                             size_t max_components) const {
  // Early exit if we don't have a defined namespace.
  if (components.empty() || !max_components) { return name; }
  std::string stream_str;
  for (size_t i = 0; i < std::min(components.size(), max_components); i++) {
    stream_str += components[i];
    stream_str += '.';
  }
  if (!stream_str.empty()) stream_str.pop_back();
  if (name.length()) {
    stream_str += '.';
    stream_str += name;
  }
  return stream_str;
}